

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O2

bool cellClipTest(QTextTable *table,QTextTableData *td,PaintContext *cell_context,
                 QTextTableCell *cell,QRectF cellRect)

{
  byte bVar1;
  long in_FS_OFFSET;
  qreal xp1;
  double xp2;
  double yp1;
  double yp2;
  EdgeData local_b8;
  EdgeData local_98;
  EdgeData local_78;
  EdgeData local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = 0;
  if ((0.0 < (cell_context->clip).w) && (bVar1 = 0, 0.0 < (cell_context->clip).h)) {
    if (td->borderCollapse == true) {
      axisEdgeData(&local_58,table,td,cell,LeftEdge);
      xp1 = local_58.width * -0.5;
      axisEdgeData(&local_78,table,td,cell,TopEdge);
      axisEdgeData(&local_98,table,td,cell,RightEdge);
      xp2 = local_98.width * 0.5;
      axisEdgeData(&local_b8,table,td,cell,BottomEdge);
      yp1 = local_78.width * -0.5;
      yp2 = local_b8.width * 0.5;
    }
    else {
      xp2 = (double)(td->super_QTextFrameData).border.val * 0.015625;
      xp1 = -xp2;
      yp1 = xp1;
      yp2 = xp2;
    }
    QRectF::adjust(&cellRect,xp1,yp1,xp2,yp2);
    bVar1 = QRectF::intersects((QRectF *)&cellRect);
    bVar1 = bVar1 ^ 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (bool)bVar1;
  }
  __stack_chk_fail();
}

Assistant:

static bool cellClipTest(QTextTable *table, QTextTableData *td,
                         const QAbstractTextDocumentLayout::PaintContext &cell_context,
                         const QTextTableCell &cell,
                         QRectF cellRect)
{
#ifdef QT_NO_CSSPARSER
    Q_UNUSED(table);
    Q_UNUSED(cell);
#endif

    if (!cell_context.clip.isValid())
        return false;

    if (td->borderCollapse) {
        // we need to account for the cell borders in the clipping test
#ifndef QT_NO_CSSPARSER
        cellRect.adjust(-axisEdgeData(table, td, cell, QCss::LeftEdge).width / 2,
                        -axisEdgeData(table, td, cell, QCss::TopEdge).width / 2,
                        axisEdgeData(table, td, cell, QCss::RightEdge).width / 2,
                        axisEdgeData(table, td, cell, QCss::BottomEdge).width / 2);
#endif
    } else {
        qreal border = td->border.toReal();
        cellRect.adjust(-border, -border, border, border);
    }

    if (!cellRect.intersects(cell_context.clip))
        return true;

    return false;
}